

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_flac_init_file_w(wchar_t *pFilePath,ma_decoding_backend_config *pConfig,
                             ma_allocation_callbacks *pAllocationCallbacks,ma_flac *pFlac)

{
  ma_dr_flac *pmVar1;
  wchar_t *in_RCX;
  ma_flac *in_RDX;
  ma_decoding_backend_config *in_RSI;
  ma_result result;
  uint in_stack_ffffffffffffffd0;
  ma_result local_4;
  
  local_4 = ma_flac_init_internal(in_RSI,in_RDX);
  if (local_4 == MA_SUCCESS) {
    pmVar1 = ma_dr_flac_open_file_w
                       (in_RCX,(ma_allocation_callbacks *)(ulong)in_stack_ffffffffffffffd0);
    *(ma_dr_flac **)(in_RCX + 0x1c) = pmVar1;
    if (*(long *)(in_RCX + 0x1c) == 0) {
      local_4 = MA_INVALID_FILE;
    }
    else {
      local_4 = MA_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_flac_init_file_w(const wchar_t* pFilePath, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_flac* pFlac)
{
    ma_result result;

    result = ma_flac_init_internal(pConfig, pFlac);
    if (result != MA_SUCCESS) {
        return result;
    }

    #if !defined(MA_NO_FLAC)
    {
        pFlac->dr = ma_dr_flac_open_file_w(pFilePath, pAllocationCallbacks);
        if (pFlac->dr == NULL) {
            return MA_INVALID_FILE;
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* flac is disabled. */
        (void)pFilePath;
        (void)pAllocationCallbacks;
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}